

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

parser_error parse_player_prop_name(parser *p)

{
  parser_error pVar1;
  char *pcVar2;
  void *pvVar3;
  
  pcVar2 = parser_getstr(p,"desc");
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar1 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    string_free(*(char **)((long)pvVar3 + 0x18));
    pcVar2 = string_make(pcVar2);
    *(char **)((long)pvVar3 + 0x18) = pcVar2;
    pVar1 = PARSE_ERROR_NONE;
  }
  return pVar1;
}

Assistant:

static enum parser_error parse_player_prop_name(struct parser *p) {
	const char *desc = parser_getstr(p, "desc");
	struct embryo_player_ability *embryo = parser_priv(p);

	if (!embryo) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	string_free(embryo->ability.name);
	embryo->ability.name = string_make(desc);
	return PARSE_ERROR_NONE;
}